

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O3

oonf_layer2_peer_address *
oonf_layer2_net_add_ip(oonf_layer2_net *l2net,oonf_layer2_origin *origin,netaddr *ip)

{
  avl_node *paVar1;
  oonf_layer2_peer_address *ptr;
  
  paVar1 = avl_find(&l2net->local_peer_ips,ip);
  if (paVar1 == (avl_node *)0x0) {
    ptr = (oonf_layer2_peer_address *)oonf_class_malloc(&_l2net_addr_class);
    if (ptr == (oonf_layer2_peer_address *)0x0) {
      return (oonf_layer2_peer_address *)0x0;
    }
    *(undefined2 *)&(ptr->ip)._type = *(undefined2 *)&ip->_type;
    paVar1 = *(avl_node **)(ip->_addr + 8);
    *(avl_node **)(ptr->ip)._addr = *(avl_node **)ip->_addr;
    *(avl_node **)((long)(ptr->ip)._addr + 8) = paVar1;
    ptr->l2net = l2net;
    (ptr->_net_node).key = ptr;
    avl_insert(&l2net->local_peer_ips,&ptr->_net_node);
    (ptr->_global_node).key = ptr;
    avl_insert(&_local_peer_ips_tree,&ptr->_global_node);
    oonf_class_event(&_l2net_addr_class,ptr,OONF_OBJECT_ADDED);
  }
  else {
    ptr = (oonf_layer2_peer_address *)&paVar1[-2].parent;
  }
  ptr->origin = origin;
  return ptr;
}

Assistant:

struct oonf_layer2_peer_address *
oonf_layer2_net_add_ip(
  struct oonf_layer2_net *l2net, const struct oonf_layer2_origin *origin, const struct netaddr *ip) {
  struct oonf_layer2_peer_address *l2addr;

  l2addr = oonf_layer2_net_get_local_ip(l2net, ip);
  if (!l2addr) {
    l2addr = oonf_class_malloc(&_l2net_addr_class);
    if (!l2addr) {
      return NULL;
    }

    /* copy data */
    memcpy(&l2addr->ip, ip, sizeof(*ip));

    /* set back reference */
    l2addr->l2net = l2net;

    /* add to tree */
    l2addr->_net_node.key = &l2addr->ip;
    avl_insert(&l2net->local_peer_ips, &l2addr->_net_node);

    l2addr->_global_node.key = &l2addr->ip;
    avl_insert(&_local_peer_ips_tree, &l2addr->_global_node);

    oonf_class_event(&_l2net_addr_class, l2addr, OONF_OBJECT_ADDED);
  }

  l2addr->origin = origin;
  return l2addr;
}